

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<float> * __thiscall
TPZFMatrix<float>::operator=(TPZFMatrix<float> *this,TPZFMatrix<float> *A)

{
  float *pfVar1;
  int64_t iVar2;
  float **ppfVar3;
  float *__dest;
  ulong uVar4;
  
  if (this == A) {
    return this;
  }
  uVar4 = (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol *
          (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  if (this->fSize < (long)uVar4) {
    if (uVar4 - (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol *
                (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow != 0) {
      __dest = (float *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
      goto LAB_00ca811c;
    }
    ppfVar3 = &this->fElem;
  }
  else {
    ppfVar3 = &this->fGiven;
  }
  __dest = *ppfVar3;
  if (0 < (long)uVar4 && __dest == (float *)0x0) {
    __dest = (float *)0x0;
    Error("Operator= <memory allocation error>.",(char *)0x0);
  }
LAB_00ca811c:
  pfVar1 = this->fElem;
  if (((pfVar1 != (float *)0x0) && (pfVar1 != __dest)) && (pfVar1 != this->fGiven)) {
    operator_delete__(pfVar1);
  }
  iVar2 = (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = iVar2;
  this->fElem = __dest;
  memcpy(__dest,A->fElem,uVar4 * 4);
  TPZMatrix<float>::operator=(&this->super_TPZMatrix<float>,&A->super_TPZMatrix<float>);
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZFMatrix<TVar> &A ) {
    if(this == &A) return *this;
    int64_t size = A.fRow * A.fCol;
    
    TVar * newElem = fElem;
    if(fSize < size && size != this->fRow*this->fCol) {
        newElem = new TVar
        [size] ;
    } else if (fSize >= size) {
        newElem = fGiven;
    }
    
    if ( newElem == NULL && size > 0) Error( "Operator= <memory allocation error>." );
    if (fElem && fElem != newElem && fElem != fGiven) delete[]( fElem );
    this->fRow  = A.fRow;
    this->fCol  = A.fCol;
    fElem = newElem;
    
    // Copia a matriz
    memcpy((void *)(fElem),(void *)(A.fElem),(size_t)size*sizeof(TVar));
    
    TPZMatrix<TVar>::operator=(A);
    
    
    return *this;
}